

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<short,_short>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<short,_short> *this)

{
  int16_t left;
  short *psVar1;
  ushort uVar2;
  bool bVar3;
  short sVar4;
  ushort uVar5;
  idx_t iVar6;
  unsigned_long uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar16;
  
  bVar15 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    sVar4 = this->minimum;
    left = this->maximum;
    if (left != sVar4) goto LAB_0171f07d;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 6;
    return true;
  }
  sVar4 = this->minimum;
  left = this->maximum;
LAB_0171f07d:
  psVar1 = &this->min_max_diff;
  bVar3 = TrySubtractOperator::Operation<short,short,short>(left,sVar4,psVar1);
  this->can_do_for = bVar3;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    sVar4 = this->minimum_delta;
    if ((this->maximum_delta == sVar4) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 8;
      return true;
    }
    uVar11 = (uint)(ushort)this->min_max_delta_diff;
    if (this->min_max_delta_diff == 0) {
      bVar10 = 0;
    }
    else {
      bVar13 = 0;
      do {
        bVar13 = bVar13 + 1;
        uVar5 = (ushort)uVar11;
        uVar11 = (uint)(int)(short)uVar5 >> 1;
      } while (1 < uVar5);
      bVar10 = 0x10;
      if (bVar13 < 0xf) {
        bVar10 = bVar13;
      }
    }
    uVar5 = *psVar1;
    if (uVar5 == 0) {
      bVar13 = 0;
    }
    else {
      bVar13 = 0x10;
      if (uVar5 != 0x8000) {
        uVar2 = -uVar5;
        if (0 < (short)uVar5) {
          uVar2 = uVar5;
        }
        uVar11 = (uint)uVar2;
        bVar9 = 0;
        do {
          bVar8 = bVar9;
          bVar9 = bVar8 + 1;
          uVar5 = (ushort)uVar11;
          uVar11 = uVar11 >> 1;
        } while (1 < uVar5);
        bVar13 = 0x10;
        if (bVar9 < 0xe) {
          bVar13 = bVar8 + 2;
        }
      }
    }
    if ((bVar10 < bVar13) && (this->mode != FOR)) {
      uVar16 = this->compression_buffer_idx;
      if (uVar16 == 0) {
        iVar6 = this->total_size + 0xc;
        uVar16 = 0;
      }
      else {
        uVar12 = 0;
        do {
          this->delta_buffer[uVar12] = this->delta_buffer[uVar12] - sVar4;
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
        iVar6 = this->total_size + 0xc;
        this->total_size = iVar6;
        if ((uVar16 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar16 & 0x1f);
          uVar16 = (uVar16 - uVar7) + 0x20;
          iVar6 = this->total_size;
        }
      }
      this->total_size = (bVar10 * uVar16 >> 3) + iVar6;
      return true;
    }
  }
  if (this->can_do_for == true) {
    uVar11 = (uint)(ushort)*psVar1;
    if (*psVar1 == 0) {
      uVar16 = 0;
    }
    else {
      bVar10 = 0;
      do {
        bVar10 = bVar10 + 1;
        uVar5 = (ushort)uVar11;
        uVar11 = (uint)(int)(short)uVar5 >> 1;
      } while (1 < uVar5);
      bVar13 = 0x10;
      if (bVar10 < 0xf) {
        bVar13 = bVar10;
      }
      uVar16 = (ulong)bVar13;
    }
    uVar12 = this->compression_buffer_idx;
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      psVar1 = this->compression_buffer;
      sVar4 = this->minimum;
      uVar14 = 0;
      do {
        psVar1[uVar14] = psVar1[uVar14] - sVar4;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      if ((uVar12 & 0x1f) != 0) {
        uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
        uVar12 = (uVar12 - uVar7) + 0x20;
      }
    }
    this->total_size = this->total_size + (uVar12 * uVar16 >> 3) + 10;
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}